

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O1

void qt_pager(int msgnum)

{
  qtmsg *pqVar1;
  int iVar2;
  qtmsg *qt_msg;
  qtmsg *qt_msg_00;
  
  iVar2 = qt_list_1->msgnum;
  qt_msg_00 = qt_list_1;
  while (0 < iVar2) {
    if (iVar2 == msgnum) goto LAB_0022a926;
    pqVar1 = qt_msg_00 + 1;
    qt_msg_00 = qt_msg_00 + 1;
    iVar2 = pqVar1->msgnum;
  }
  qt_msg_00 = (qtmsg *)0x0;
LAB_0022a926:
  if (qt_msg_00 == (qtmsg *)0x0) {
    warning("qt_pager: message %d not found.");
    return;
  }
  dlb_fseek(msg_file,qt_msg_00->offset,0);
  if (qt_msg_00->delivery == 'p') {
    deliver_by_pline(qt_msg_00);
    return;
  }
  deliver_by_window(qt_msg_00);
  return;
}

Assistant:

void qt_pager(int msgnum)
{
	struct qtmsg *qt_msg;

	if (!(qt_msg = msg_in(qt_list.chrole, msgnum))) {
		warning("qt_pager: message %d not found.", msgnum);
		return;
	}

	dlb_fseek(msg_file, qt_msg->offset, SEEK_SET);
	if (qt_msg->delivery == 'p')
		deliver_by_pline(qt_msg);
	else	deliver_by_window(qt_msg);
	return;
}